

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

char * nni_http_get_reason(nng_http *conn)

{
  long lVar1;
  anon_struct_16_2_3ef68a38 *paVar2;
  long lVar3;
  
  if (conn->rsn != (char *)0x0) {
    return conn->rsn;
  }
  if (conn->code == NNG_HTTP_STATUS_OK) {
    paVar2 = nni_http_reason::http_status;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x3a0) {
        return "Unknown HTTP Status";
      }
      lVar1 = lVar3 + 0x10;
    } while (*(nng_http_status *)((long)&nni_http_reason::http_status[1].code + lVar3) != conn->code
            );
    paVar2 = (anon_struct_16_2_3ef68a38 *)(lVar3 + 0x156530);
  }
  return paVar2->mesg;
}

Assistant:

const char *
nni_http_get_reason(nng_http *conn)
{
	return (conn->rsn ? conn->rsn : nni_http_reason(conn->code));
}